

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

void TargetFilesystemArtifactDependencyCMP0112::AddDependency
               (cmGeneratorTarget *target,cmGeneratorExpressionContext *context)

{
  cmLocalGenerator *this;
  cmMakefile *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  PolicyStatus PVar3;
  string *psVar4;
  cmake *this_01;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string err;
  cmGeneratorTarget *local_b0;
  string local_a8;
  string local_88;
  undefined1 local_68 [32];
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  local_b0 = target;
  std::
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  ::_M_insert_unique<cmGeneratorTarget_const*const&>
            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              *)&context->AllTargets,&local_b0);
  this = context->LG;
  PVar3 = cmPolicies::PolicyMap::Get(&local_b0->PolicyMap,CMP0112);
  if (PVar3 != OLD) {
    if (PVar3 != WARN) {
      return;
    }
    this_00 = this->Makefile;
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"CMAKE_POLICY_WARNING_CMP0112","");
    bVar2 = cmMakefile::PolicyOptionalWarningEnabled(this_00,(string *)local_68);
    id = extraout_EDX;
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      id = extraout_EDX_00;
    }
    if (bVar2) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_88,(cmPolicies *)0x70,id);
      _Var1._M_p = local_88._M_dataplus._M_p;
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(local_b0);
      local_68._0_8_ = local_88._M_string_length;
      local_68._8_8_ = _Var1._M_p;
      local_68._16_8_ = 0x26;
      local_68._24_8_ = "\nDependency being added to target:\n  \"";
      local_40 = (psVar4->_M_dataplus)._M_p;
      local_48 = psVar4->_M_string_length;
      local_38 = 2;
      local_30 = "\"\n";
      views._M_len = 4;
      views._M_array = (iterator)local_68;
      cmCatViews_abi_cxx11_(&local_a8,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      this_01 = cmLocalGenerator::GetCMakeInstance(this);
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_a8,&context->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  ::_M_insert_unique<cmGeneratorTarget*const&>
            ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
              *)&context->DependTargets,&local_b0);
  return;
}

Assistant:

static void AddDependency(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context)
  {
    context->AllTargets.insert(target);
    cmLocalGenerator* lg = context->LG;
    switch (target->GetPolicyStatusCMP0112()) {
      case cmPolicies::WARN:
        if (lg->GetMakefile()->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0112")) {
          std::string err =
            cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0112),
                     "\nDependency being added to target:\n  \"",
                     target->GetName(), "\"\n");
          lg->GetCMakeInstance()->IssueMessage(MessageType ::AUTHOR_WARNING,
                                               err, context->Backtrace);
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        context->DependTargets.insert(target);
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        break;
    }
  }